

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

void __thiscall Liby::http::RequestParser::parse(RequestParser *this,char *begin,char *end)

{
  char *local_68;
  char *local_58;
  char local_34 [4];
  char *local_30;
  char *finish;
  char *pcStack_20;
  bool flag;
  char *end_local;
  char *begin_local;
  RequestParser *this_local;
  
  local_30 = (char *)0x0;
  pcStack_20 = end;
  end_local = begin;
  begin_local = (char *)this;
  switch(this->progress_) {
  case 1:
    local_34[3] = 0x20;
    local_30 = std::find<char_const*,char>(begin,end,local_34 + 3);
    if (local_30 == (char *)0x0) {
      return;
    }
    finish._7_1_ = ParseMethod(this,end_local,local_30);
    if (!(bool)finish._7_1_) {
      return;
    }
    local_30 = local_30 + 1;
    this->bytes_ = this->bytes_ + ((int)local_30 - (int)end_local);
    end_local = local_30;
switchD_00150849_caseD_2:
    local_34[2] = 0x20;
    local_30 = std::find<char_const*,char>(end_local,pcStack_20,local_34 + 2);
    if ((local_30 != (char *)0x0) &&
       (finish._7_1_ = ParseURI(this,end_local,local_30), (bool)finish._7_1_)) {
      local_30 = local_30 + 1;
      this->bytes_ = this->bytes_ + ((int)local_30 - (int)end_local);
      end_local = local_30;
switchD_00150849_caseD_3:
      local_34[1] = 10;
      local_30 = std::find<char_const*,char>(end_local,pcStack_20,local_34 + 1);
      if (local_30 != (char *)0x0) {
        local_58 = local_30;
        if (local_30[-1] == '\r') {
          local_58 = local_30 + -1;
        }
        finish._7_1_ = ParseHttpVersion(this,end_local,local_58);
        if ((bool)finish._7_1_) {
          local_30 = local_30 + 1;
          this->bytes_ = this->bytes_ + ((int)local_30 - (int)end_local);
          end_local = local_30;
switchD_00150849_caseD_4:
          while (end_local != pcStack_20) {
            local_34[0] = '\n';
            local_30 = std::find<char_const*,char>(end_local,pcStack_20,local_34);
            if (local_30 == (char *)0x0) {
              return;
            }
            if ((end_local == local_30) || (end_local + 1 == local_30)) {
              this->progress_ = 5;
              this->bytes_ = this->bytes_ + (((int)local_30 + 1) - (int)end_local);
              return;
            }
            local_68 = local_30;
            if (local_30[-1] == '\r') {
              local_68 = local_30 + -1;
            }
            finish._7_1_ = ParseHeader(this,end_local,local_68);
            if (!(bool)finish._7_1_) {
              return;
            }
            local_30 = local_30 + 1;
            this->bytes_ = this->bytes_ + ((int)local_30 - (int)end_local);
            end_local = local_30;
          }
        }
      }
    }
    return;
  case 2:
    goto switchD_00150849_caseD_2;
  case 3:
    goto switchD_00150849_caseD_3;
  case 4:
    goto switchD_00150849_caseD_4;
  default:
    return;
  }
}

Assistant:

void RequestParser::parse(const char *begin, const char *end) {
    bool flag;
    const char *finish = nullptr;
    switch (progress_) {
    default:
    case Good:
        break;
    case ParsingMethod:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseMethod(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingURI:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseURI(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingVersion:
        finish = std::find(begin, end, '\n');
        if (finish == nullptr)
            return;
        flag = ParseHttpVersion(begin,
                                *(finish - 1) == '\r' ? finish - 1 : finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingHeaders: {
        while (begin != end) {
            finish = std::find(begin, end, '\n');
            if (finish == nullptr)
                return;
            if (begin == finish || begin + 1 == finish) {
                progress_ = Good;
                bytes_ += ++finish - begin;
                return;
            }
            flag =
                ParseHeader(begin, *(finish - 1) == '\r' ? finish - 1 : finish);
            if (flag == false)
                return;
            bytes_ += ++finish - begin;
            begin = finish;
        }
    } break;
    }
}